

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O0

void proto2_nofieldpresence_unittest::TestAllMapTypes::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  TestAllMapTypes **v1;
  TestAllMapTypes **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestAllMapTypes *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestAllMapTypes *from;
  TestAllMapTypes *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestAllMapTypes *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestAllMapTypes *)to_msg;
  _this = (TestAllMapTypes *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_nofieldpresence_unittest::TestAllMapTypes_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_nofieldpresence_unittest::TestAllMapTypes*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_nofieldpresence_unittest::TestAllMapTypes_const*,proto2_nofieldpresence_unittest::TestAllMapTypes*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_no_field_presence.pb.cc"
               ,0xdaf,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  google::protobuf::internal::
  TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom((TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&(from->field_0)._impl_,
              (TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(absl_log_internal_check_op_result + 0x10));
  google::protobuf::internal::
  TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::MergeFrom
            (&(from->field_0)._impl_.map_int32_foreign_enum_.
              super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>,
             (TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)
             (absl_log_internal_check_op_result + 0x40));
  google::protobuf::internal::
  TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>::MergeFrom
            (&(from->field_0)._impl_.map_int32_foreign_message_.
              super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>,
             (TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage> *)
             (absl_log_internal_check_op_result + 0x70));
  google::protobuf::internal::
  TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::MergeFrom
            (&(from->field_0)._impl_.map_int32_explicit_foreign_message_.
              super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
             ,(TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
               *)(absl_log_internal_check_op_result + 0xa0));
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestAllMapTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllMapTypes*>(&to_msg);
  auto& from = static_cast<const TestAllMapTypes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_nofieldpresence_unittest.TestAllMapTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_int32_bytes_.MergeFrom(from._impl_.map_int32_bytes_);
  _this->_impl_.map_int32_foreign_enum_.MergeFrom(from._impl_.map_int32_foreign_enum_);
  _this->_impl_.map_int32_foreign_message_.MergeFrom(from._impl_.map_int32_foreign_message_);
  _this->_impl_.map_int32_explicit_foreign_message_.MergeFrom(from._impl_.map_int32_explicit_foreign_message_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}